

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

bool __thiscall pg::DTLSolver::extractTangles(DTLSolver *this,int startvertex,bitset *R,int *str)

{
  pointer *pppiVar1;
  ulong *puVar2;
  vector<int,std::allocator<int>> *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  iterator iVar7;
  Game *pGVar8;
  Game *pGVar9;
  uint64_t *puVar10;
  Game *pGVar11;
  uint64_t *puVar12;
  size_t sVar13;
  pointer ppiVar14;
  pointer piVar15;
  int *piVar16;
  iterator iVar17;
  char cVar18;
  bool bVar19;
  byte bVar20;
  ulong uVar21;
  pointer ppiVar22;
  ostream *poVar23;
  Error *this_01;
  ulong uVar24;
  Game *pGVar25;
  int *piVar26;
  uint uVar27;
  int iVar28;
  Game *pGVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  uint *puVar33;
  int *v_1;
  ulong uVar34;
  int *piVar35;
  uint *puVar36;
  iterator __end2;
  int *_tout;
  int pr;
  int tidx;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int_*,_std::allocator<int_*>_> *__range2_1;
  int *_vv;
  _label_vertex local_98;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int,std::allocator<int>> *local_68;
  vector<int*,std::allocator<int*>> *local_60;
  vector<int,std::allocator<int>> *local_58;
  vector<int*,std::allocator<int*>> *local_50;
  bitset *local_48;
  ulong local_40;
  int *local_38;
  
  uVar21 = (ulong)startvertex;
  local_84 = ((this->super_Solver).game)->_priority[uVar21];
  iVar28 = (this->pea_vS).pointer;
  (this->pea_vS).pointer = iVar28 + 1;
  (this->pea_vS).queue[iVar28] = startvertex;
  iVar28 = (this->pea_iS).pointer;
  (this->pea_iS).pointer = iVar28 + 1;
  (this->pea_iS).queue[iVar28] = 0;
  puVar2 = (this->pea_root)._bits + (uVar21 >> 6);
  *puVar2 = *puVar2 | 1L << (uVar21 & 0x3f);
  uVar3 = this->pea_curidx;
  this->pea_curidx = uVar3 + 1;
  this->pea_vidx[uVar21] = uVar3;
  if ((this->pea_vS).pointer == 0) {
    bVar20 = 0;
  }
  else {
    local_68 = (vector<int,std::allocator<int>> *)&this->tangle;
    local_50 = (vector<int*,std::allocator<int*>> *)&this->tv;
    local_58 = (vector<int,std::allocator<int>> *)&this->tpr;
    local_60 = (vector<int*,std::allocator<int*>> *)&this->tout;
    local_70 = (vector<int,std::allocator<int>> *)&this->dom_vector;
    local_78 = 0;
    local_80 = local_84;
    local_48 = R;
    do {
      pGVar25 = (this->super_Solver).game;
      puVar36 = (this->pea_vS).queue;
      uVar3 = puVar36[(long)(this->pea_vS).pointer + -1];
      uVar21 = (ulong)uVar3;
      puVar6 = (this->pea_iS).queue;
      lVar30 = (long)(this->pea_iS).pointer;
      uVar27 = puVar6[lVar30 + -1];
      bVar20 = (byte)uVar3;
      if (((((pGVar25->_owner)._bits[(ulong)(long)(int)uVar3 >> 6] >> (uVar21 & 0x3f) & 1) == 0 ^
           (byte)local_80) & 1) == 0) {
        iVar28 = pGVar25->_firstouts[(int)uVar3];
        piVar35 = pGVar25->_outedges;
        if (uVar27 != 0) {
          puVar33 = this->pea_vidx;
          if (puVar33[piVar35[(long)iVar28 + (ulong)(uVar27 - 1)]] < puVar33[uVar21]) {
            puVar33[uVar21] = puVar33[piVar35[(long)iVar28 + (ulong)(uVar27 - 1)]];
            puVar2 = (this->pea_root)._bits + (uVar3 >> 6);
            *puVar2 = *puVar2 & (-2L << (bVar20 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar20 & 0x3f));
          }
        }
        puVar10 = local_48->_bits;
        puVar33 = this->pea_vidx;
        puVar12 = (this->pea_root)._bits;
        local_40 = (ulong)(uVar3 >> 6);
        do {
          uVar4 = piVar35[(long)iVar28 + (ulong)uVar27];
          uVar24 = (ulong)(int)uVar4;
          if (uVar24 == 0xffffffffffffffff) {
            iVar32 = 5;
          }
          else {
            if ((puVar10[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0) {
              uVar5 = puVar33[uVar24];
              if (uVar5 == 0) {
                puVar6[(long)(this->pea_iS).pointer + -1] = uVar27 + 1;
                iVar32 = (this->pea_vS).pointer;
                (this->pea_vS).pointer = iVar32 + 1;
                puVar36[iVar32] = uVar4;
                iVar32 = (this->pea_iS).pointer;
                (this->pea_iS).pointer = iVar32 + 1;
                puVar6[iVar32] = 0;
                puVar2 = puVar12 + (uVar24 >> 6);
                *puVar2 = *puVar2 | 1L << (uVar24 & 0x3f);
                uVar5 = this->pea_curidx;
                this->pea_curidx = uVar5 + 1;
                puVar33[uVar24] = uVar5;
                iVar32 = 4;
                goto LAB_0017486d;
              }
              if (uVar5 < puVar33[uVar21]) {
                puVar33[uVar21] = uVar5;
                puVar2 = puVar12 + local_40;
                *puVar2 = *puVar2 & (-2L << (bVar20 & 0x3f) |
                                    0xfffffffffffffffeU >> 0x40 - (bVar20 & 0x3f));
              }
            }
            uVar27 = uVar27 + 1;
            iVar32 = 0;
          }
LAB_0017486d:
        } while (iVar32 == 0);
        if (iVar32 == 5) {
          iVar32 = 0;
        }
        if (iVar32 == 0) goto LAB_001748fc;
      }
      else {
        uVar4 = str[uVar21];
        uVar24 = (ulong)(int)uVar4;
        if ((uVar27 == 0) && (puVar33 = this->pea_vidx, puVar33[uVar24] == 0)) {
          puVar6[lVar30 + -1] = 1;
          iVar28 = (this->pea_vS).pointer;
          (this->pea_vS).pointer = iVar28 + 1;
          puVar36[iVar28] = uVar4;
          iVar28 = (this->pea_iS).pointer;
          (this->pea_iS).pointer = iVar28 + 1;
          puVar6[iVar28] = 0;
          puVar2 = (this->pea_root)._bits + (uVar24 >> 6);
          *puVar2 = *puVar2 | 1L << (uVar24 & 0x3f);
          uVar27 = this->pea_curidx;
          this->pea_curidx = uVar27 + 1;
          puVar33[uVar24] = uVar27;
          iVar32 = 4;
          bVar19 = false;
        }
        else {
          puVar33 = this->pea_vidx;
          iVar32 = 0;
          bVar19 = true;
          if (puVar33[uVar24] < puVar33[uVar21]) {
            puVar33[uVar21] = puVar33[uVar24];
            puVar2 = (this->pea_root)._bits + (uVar3 >> 6);
            *puVar2 = *puVar2 & (-2L << (bVar20 & 0x3f) |
                                0xfffffffffffffffeU >> 0x40 - (bVar20 & 0x3f));
          }
        }
        if (bVar19) {
LAB_001748fc:
          piVar35 = &(this->pea_vS).pointer;
          *piVar35 = *piVar35 + -1;
          piVar35 = &(this->pea_iS).pointer;
          *piVar35 = *piVar35 + -1;
          pGVar25 = (Game *)(ulong)(uVar3 >> 6);
          if (((this->pea_root)._bits[(long)pGVar25] >> (uVar21 & 0x3f) & 1) == 0) {
            iVar28 = (this->pea_S).pointer;
            (this->pea_S).pointer = iVar28 + 1;
            (this->pea_S).queue[iVar28] = uVar3;
LAB_00175395:
            iVar32 = 2;
          }
          else {
            this->pea_curidx = this->pea_curidx + -1;
            local_98.g = (Game *)CONCAT44(local_98.g._4_4_,uVar3);
            iVar7._M_current =
                 (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_68,iVar7,(int *)&local_98);
            }
            else {
              *iVar7._M_current = uVar3;
              (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            do {
              iVar28 = (this->pea_S).pointer;
              if ((long)iVar28 == 0) break;
              uVar4 = (this->pea_S).queue[(long)iVar28 + -1];
              pGVar25 = (Game *)(long)(int)uVar4;
              local_98.g = (Game *)CONCAT44(local_98.g._4_4_,uVar4);
              puVar33 = this->pea_vidx;
              uVar27 = puVar33[uVar21];
              uVar5 = puVar33[(long)pGVar25];
              if (uVar5 < uVar27) break;
              (this->pea_S).pointer = iVar28 + -1;
              this->pea_curidx = this->pea_curidx + -1;
              puVar33[(long)pGVar25] = 0xffffffff;
              iVar7._M_current =
                   (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_68,iVar7,(int *)&local_98);
              }
              else {
                *iVar7._M_current = uVar4;
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar7._M_current + 1;
              }
            } while (uVar27 <= uVar5);
            this->pea_vidx[uVar21] = 0xffffffff;
            if (((4 < (ulong)((long)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start)) ||
                (str[uVar21] == uVar3)) ||
               ((str[uVar21] == 0xffffffff &&
                (bVar19 = Game::has_edge((this->super_Solver).game,uVar3,uVar3), bVar19)))) {
              pGVar8 = (Game *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
              pGVar9 = (Game *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
              if (pGVar8 != pGVar9) {
                puVar10 = (this->escapes)._bits;
                pGVar25 = pGVar8;
                do {
                  uVar21 = (ulong)(int)pGVar25->n_vertices;
                  puVar2 = puVar10 + (uVar21 >> 6);
                  *puVar2 = *puVar2 | 1L << (uVar21 & 0x3f);
                  pGVar25 = (Game *)((long)&pGVar25->n_vertices + 4);
                } while (pGVar25 != pGVar9);
              }
              if (pGVar8 != pGVar9) {
                pGVar11 = (this->super_Solver).game;
                pGVar25 = (Game *)(this->G)._bits;
                puVar10 = (pGVar11->_owner)._bits;
                pGVar29 = pGVar8;
                do {
                  uVar21 = (ulong)(int)pGVar29->n_vertices;
                  if ((((puVar10[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0 ^ (byte)local_80) & 1) ==
                      0) {
                    uVar3 = pGVar11->_outedges[pGVar11->_firstouts[uVar21]];
                    if (uVar3 != 0xffffffff) {
                      puVar36 = (this->tangleto).queue;
                      puVar12 = (this->escapes)._bits;
                      puVar33 = (uint *)(pGVar11->_outedges + (long)pGVar11->_firstouts[uVar21] + 1)
                      ;
                      do {
                        uVar21 = (ulong)(long)(int)uVar3 >> 6;
                        if (((ulong)(&pGVar25->n_vertices)[uVar21] >> ((ulong)uVar3 & 0x3f) & 1) !=
                            0) {
                          uVar34 = 1L << ((ulong)uVar3 & 0x3f);
                          uVar24 = puVar12[uVar21];
                          if ((uVar24 & uVar34) == 0) {
                            puVar12[uVar21] = uVar24 | uVar34;
                            iVar28 = (this->tangleto).pointer;
                            (this->tangleto).pointer = iVar28 + 1;
                            puVar36[iVar28] = uVar3;
                          }
                        }
                        uVar3 = *puVar33;
                        puVar33 = puVar33 + 1;
                      } while (uVar3 != 0xffffffff);
                    }
                  }
                  pGVar29 = (Game *)((long)&pGVar29->n_vertices + 4);
                } while (pGVar29 != pGVar9);
              }
              sVar13 = (this->escapes)._bitssize;
              if (sVar13 != 0) {
                memset((this->escapes)._bits,0,sVar13 << 3);
              }
              if ((this->tangleto).pointer == 0) {
                if ((this->super_Solver).trace != 0) {
                  poVar23 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
                  poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_84);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\x1b[m",3);
                  poVar23 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23," (depth ",8);
                  poVar23 = (ostream *)std::ostream::operator<<(poVar23,this->cur_depth);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
                  if (this->cur_depth != 0) {
                    this_01 = (Error *)__cxa_allocate_exception(0x40);
                    Error::Error(this_01,"logic error",
                                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                                 ,0x161);
                    __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
                  }
                  if (1 < (this->super_Solver).trace) {
                    piVar16 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                    for (piVar35 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; piVar35 != piVar16;
                        piVar35 = piVar35 + 1) {
                      iVar28 = *piVar35;
                      poVar23 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar23," \x1b[1;36m",8);
                      local_98.g = (this->super_Solver).game;
                      local_98.v = iVar28;
                      poVar23 = operator<<(poVar23,&local_98);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\x1b[m",3);
                      if (str[iVar28] != -1) {
                        poVar23 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar23,"->",2);
                        local_98.v = str[iVar28];
                        pGVar25 = (this->super_Solver).game;
                        local_98.g = pGVar25;
                        operator<<(poVar23,&local_98);
                      }
                    }
                  }
                  poVar23 = (this->super_Solver).logger;
                  cVar18 = (char)poVar23;
                  std::ios::widen((char)poVar23->_vptr_basic_ostream[-3] + cVar18);
                  std::ostream::put(cVar18);
                  std::ostream::flush();
                }
                puVar6 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                for (puVar36 = (uint *)(this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start; puVar36 != puVar6;
                    puVar36 = puVar36 + 1) {
                  uVar4 = *puVar36;
                  uVar21 = (ulong)(int)uVar4;
                  local_98.g = (Game *)CONCAT44(local_98.g._4_4_,uVar4);
                  pGVar25 = (Game *)(this->S)._bits;
                  if (((ulong)(&pGVar25->n_vertices)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
                    (&pGVar25->n_vertices)[uVar21 >> 6] =
                         (&pGVar25->n_vertices)[uVar21 >> 6] | 1L << (uVar21 & 0x3f);
                    iVar28 = (this->SQ).pointer;
                    (this->SQ).pointer = iVar28 + 1;
                    (this->SQ).queue[iVar28] = uVar4;
                    iVar7._M_current =
                         (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar7._M_current ==
                        (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_70,iVar7,(int *)&local_98);
                    }
                    else {
                      *iVar7._M_current = uVar4;
                      (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                    }
                    iVar7._M_current =
                         (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    pGVar25 = (Game *)str;
                    if (iVar7._M_current ==
                        (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (local_70,iVar7,str + (int)local_98.g);
                    }
                    else {
                      *iVar7._M_current = str[(int)local_98.g];
                      (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                    }
                  }
                }
                this->dominions = this->dominions + 1;
                piVar15 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                local_78 = CONCAT71((int7)((ulong)pGVar25 >> 8),1);
                iVar32 = 2;
                if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish != piVar15) {
                  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = piVar15;
                }
              }
              else {
                if (pGVar8 != pGVar9) {
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (pGVar8,pGVar9,(int)LZCOUNT((long)pGVar9 - (long)pGVar8 >> 2) * 2 ^ 0x7e
                            );
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (pGVar8,pGVar9);
                }
                ppiVar22 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ppiVar14 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                if (ppiVar22 != ppiVar14) {
                  piVar15 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar21 = (ulong)((long)(this->tangle).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar15) >> 2;
                  iVar28 = (int)uVar21;
                  bVar19 = false;
                  do {
                    if (iVar28 == 0) {
                      uVar24 = 0;
                    }
                    else {
                      uVar34 = 0;
                      do {
                        if ((*ppiVar22)[uVar34 * 2] != piVar15[uVar34]) goto LAB_00174bef;
                        uVar34 = uVar34 + 1;
                        uVar24 = (ulong)(uint)(iVar28 * 2);
                      } while ((uVar21 & 0xffffffff) != uVar34);
                    }
                    if ((*ppiVar22)[uVar24] == -1) {
                      bVar19 = true;
                    }
LAB_00174bef:
                  } while ((!bVar19) && (ppiVar22 = ppiVar22 + 1, ppiVar22 != ppiVar14));
                  if (bVar19) {
                    if (0 < (this->super_Solver).trace) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((this->super_Solver).logger,
                                 "\x1b[1;38;5;198mduplicate tangle\x1b[m",0x20);
                      if (1 < (this->super_Solver).trace) {
                        piVar16 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                        for (piVar35 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start; piVar35 != piVar16;
                            piVar35 = piVar35 + 1) {
                          poVar23 = (this->super_Solver).logger;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar23," \x1b[1;36m",8);
                          local_98.v = *piVar35;
                          local_98.g = (this->super_Solver).game;
                          poVar23 = operator<<(poVar23,&local_98);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\x1b[m",3);
                          if (str[*piVar35] != -1) {
                            poVar23 = (this->super_Solver).logger;
                            std::__ostream_insert<char,std::char_traits<char>>(poVar23,"->",2);
                            local_98.v = str[*piVar35];
                            local_98.g = (this->super_Solver).game;
                            operator<<(poVar23,&local_98);
                          }
                        }
                      }
                      poVar23 = (this->super_Solver).logger;
                      cVar18 = (char)poVar23;
                      std::ios::widen((char)poVar23->_vptr_basic_ostream[-3] + cVar18);
                      std::ostream::put(cVar18);
                      std::ostream::flush();
                    }
                    piVar15 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish != piVar15) {
                      (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = piVar15;
                    }
                    (this->tangleto).pointer = 0;
                    goto LAB_00175395;
                  }
                }
                if (0 < (this->super_Solver).trace) {
                  poVar23 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23,"\x1b[1;38;5;198mnew tangle ",0x18);
                  poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_84);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\x1b[m (",5);
                  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
                  poVar23 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23," (depth ",8);
                  poVar23 = (ostream *)std::ostream::operator<<(poVar23,this->cur_depth);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
                  if (1 < (this->super_Solver).trace) {
                    piVar16 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                    for (piVar35 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; piVar35 != piVar16;
                        piVar35 = piVar35 + 1) {
                      iVar28 = *piVar35;
                      poVar23 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar23," \x1b[1;36m",8);
                      local_98.g = (this->super_Solver).game;
                      local_98.v = iVar28;
                      poVar23 = operator<<(poVar23,&local_98);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar23,"\x1b[m",3);
                      if (str[iVar28] != -1) {
                        poVar23 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar23,"->",2);
                        local_98.v = str[iVar28];
                        local_98.g = (this->super_Solver).game;
                        operator<<(poVar23,&local_98);
                      }
                    }
                  }
                  poVar23 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23," with ",6);
                  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23," escape vertices.",0x11);
                  poVar23 = (this->super_Solver).logger;
                  cVar18 = (char)poVar23;
                  std::ios::widen((char)poVar23->_vptr_basic_ostream[-3] + cVar18);
                  std::ostream::put(cVar18);
                  std::ostream::flush();
                }
                local_7c = (int)((ulong)((long)(this->tpr).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)(this->tpr).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2);
                uVar3 = (this->tangleto).pointer;
                uVar21 = (ulong)uVar3;
                if (uVar3 != 0) {
                  uVar24 = 0;
                  do {
                    this_00 = (vector<int,std::allocator<int>> *)
                              (this->tin + (this->tangleto).queue[uVar24]);
                    iVar7._M_current = *(int **)(this_00 + 8);
                    if (iVar7._M_current == *(int **)(this_00 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (this_00,iVar7,&local_7c);
                    }
                    else {
                      *iVar7._M_current = local_7c;
                      *(int **)(this_00 + 8) = iVar7._M_current + 1;
                    }
                    uVar24 = uVar24 + 1;
                    uVar21 = (ulong)(uint)(this->tangleto).pointer;
                  } while (uVar24 < uVar21);
                }
                local_98.g = (Game *)operator_new__((ulong)((int)uVar21 + 1) << 2);
                if ((int)uVar21 != 0) {
                  puVar36 = (this->tangleto).queue;
                  lVar30 = uVar21 + 1;
                  lVar31 = 0;
                  do {
                    *(undefined4 *)((long)&(local_98.g)->n_vertices + lVar31) =
                         *(undefined4 *)((long)puVar36 + lVar31);
                    lVar30 = lVar30 + -1;
                    lVar31 = lVar31 + 4;
                  } while (1 < lVar30);
                }
                *(int *)((long)&(local_98.g)->n_vertices + uVar21 * 4) = -1;
                iVar17._M_current =
                     (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar17._M_current ==
                    (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                            (local_60,iVar17,(int **)&local_98);
                }
                else {
                  *iVar17._M_current = (int *)local_98.g;
                  pppiVar1 = &(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl
                              .super__Vector_impl_data._M_finish;
                  *pppiVar1 = *pppiVar1 + 1;
                }
                piVar35 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar16 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                local_38 = (int *)operator_new__(-(ulong)(((long)piVar16 - (long)piVar35 >> 2 &
                                                          0x6000000000000000U) != 0) |
                                                 ((long)piVar16 - (long)piVar35) * 2 + 4U);
                if (piVar16 == piVar35) {
                  uVar21 = 0;
                }
                else {
                  piVar26 = local_38 + 1;
                  iVar28 = 0;
                  do {
                    iVar32 = *piVar35;
                    piVar26[-1] = iVar32;
                    *piVar26 = str[iVar32];
                    piVar35 = piVar35 + 1;
                    piVar26 = piVar26 + 2;
                    iVar28 = iVar28 + -2;
                  } while (piVar35 != piVar16);
                  uVar21 = (ulong)(uint)-iVar28;
                }
                local_38[uVar21] = -1;
                iVar17._M_current =
                     (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar17._M_current ==
                    (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
                            (local_50,iVar17,&local_38);
                }
                else {
                  *iVar17._M_current = local_38;
                  pppiVar1 = &(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppiVar1 = *pppiVar1 + 1;
                }
                iVar7._M_current =
                     (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar7._M_current ==
                    (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_58,iVar7,&local_84);
                }
                else {
                  *iVar7._M_current = local_84;
                  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                }
                this->tangles = this->tangles + 1;
                piVar15 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish != piVar15) {
                  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = piVar15;
                }
                (this->tangleto).pointer = 0;
                local_78 = CONCAT71((int7)((ulong)piVar15 >> 8),1);
                iVar32 = 0;
              }
            }
            else {
              piVar15 = (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar32 = 2;
              if ((this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar15) {
                (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar15;
              }
            }
          }
        }
      }
    } while ((iVar32 == 4) || ((this->pea_vS).pointer != 0));
    bVar20 = (byte)local_78;
  }
  (this->pea_S).pointer = 0;
  return (bool)(bVar20 & 1);
}

Assistant:

bool
DTLSolver::extractTangles(int startvertex, bitset &R, int *str)
{
    bool new_tangles = false;
    const int pr = priority(startvertex);
    const int pl = pr&1;

    /**
     * The following is the nonrecursive implementation of David Pearce,
     * "A space-efficient algorithm for finding strongly connected components" (IPL, 2016),
     * modified to on-the-fly restrict the graph by <R> and <str>.
     */

    // beginVisiting
    pea_vS.push(startvertex);
    pea_iS.push(0);
    pea_root[startvertex] = true;
    pea_vidx[startvertex] = pea_curidx++;
    while (pea_vS.nonempty()) {
pearce_again:
        // visitLoop
        const unsigned int n = pea_vS.back();
        unsigned int i = pea_iS.back();

        if (owner(n) != pl) {
            auto edges = outs(n);
            if (i>0) {
                // finishEdge
                const int w = edges[i-1];
                if (pea_vidx[w] < pea_vidx[n]) {
                    pea_vidx[n] = pea_vidx[w];
                    pea_root[n] = false;
                }
            }
            for (;;) {
                const int to = edges[i];
                if (to == -1) break; // done
                // beginEdge
                if (R[to]) {
                    if (pea_vidx[to] == 0) {
                        pea_iS.back() = i+1;
                        // beginVisiting
                        pea_vS.push(to);
                        pea_iS.push(0);
                        pea_root[to] = true;
                        pea_vidx[to] = pea_curidx++;
                        goto pearce_again; // break; continue;
                    } else {
                        // finishEdge
                        if (pea_vidx[to] < pea_vidx[n]) {
                            pea_vidx[n] = pea_vidx[to];
                            pea_root[n] = false;
                        }
                    }
                }
                i++;
            }
        } else {
            const int s = str[n];
            if (i == 0) {
                // beginEdge
                if (pea_vidx[s] == 0) {
                    pea_iS.back() = 1;
                    // beginVisiting
                    pea_vS.push(s);
                    pea_iS.push(0);
                    pea_root[s] = true;
                    pea_vidx[s] = pea_curidx++;
                    goto pearce_again; // break; continue;
                }
            }
            // finishEdge
            if (pea_vidx[s] < pea_vidx[n]) {
                pea_vidx[n] = pea_vidx[s];
                pea_root[n] = false;
            }
        }
        // finishVisiting
        pea_vS.pop();
        pea_iS.pop();
        if (pea_root[n]) {
            pea_curidx -= 1;
            tangle.push_back(n);
            while (pea_S.nonempty()) {
                const int t = pea_S.back();
                if (pea_vidx[n]>pea_vidx[t]) break;
                pea_S.pop();
                pea_curidx -= 1;
                pea_vidx[t] = (unsigned int)-1;
                tangle.push_back(t);
            }
            pea_vidx[n] = (unsigned int)-1;
        } else {
            pea_S.push(n);
            continue;
        }

        /**
         * End of Pearce's algorithm.
         * At this point, we have an SCC in <tangle>.
         *
         * Now check if the SCC is nontrivial, i.e., contains a cycle, i.e., either 2+ vertices
         * or a self-loop.
         */

        const bool is_tangle = (tangle.size() > 1) or
            ((unsigned int)str[n] == n) or
            (str[n] == -1 and game.has_edge(n, n));
        if (!is_tangle) {
            tangle.clear();
            continue;
        }

        /**
         * We have a tangle. Compute the outgoing edges (into <tangleto>) and the next highest region.
         */

        for (const int v : tangle) escapes[v] = true;

        for (const int v : tangle) {
            if (owner(v) != pl) {
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !escapes[to]) {
                        escapes[to] = true;
                        tangleto.push(to);
                    }
                }
            }
        }

        escapes.reset();

        /**
         * If there are no outgoing edges, then we have found a dominion.
         */

        if (tangleto.empty()) {
            // dominion
            if (trace) {
                logger << "\033[1;38;5;201mdominion \033[36m" << pr << "\033[m";
                logger << " (depth " << cur_depth <<")";
                if (cur_depth != 0) {
                    LOGIC_ERROR;
                    exit(-1);
                }
#ifndef NDEBUG
                if (trace >= 2) {
                    for (const int v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            for (const int v : tangle) {
                // if not yet added to solve queue, mark and add it
                if (S[v] == false) {
                    S[v] = true;
                    SQ.push(v);
                    dom_vector.push_back(v);
                    dom_vector.push_back(str[v]);
                }
            }
            dominions++;
            tangle.clear();
            new_tangles = true;
            continue;
        }

        /**
         * We're not a dominion, we're a tangle.
         */

#if CHECK_UNIQUE
        /** 
         * First we sort.
         */
        std::sort(tangle.begin(), tangle.end());
        int tsize = tangle.size();

        /**
         * Then we check if it already exists.
         */
        bool already_exists = false;
        for (auto &_tv : tv) {
            for (int i=0; ; i++) {
                if (i == tsize) {
                    if (_tv[2*i] == -1) already_exists = true;
                    break;
                } else if (_tv[2*i] != tangle[i]) {
                    break;
                }
            }
            if (already_exists) break;
        }
        if (already_exists) {
            if (trace >= 1) {
                logger << "\033[1;38;5;198mduplicate tangle\033[m";
#ifndef NDEBUG
                if (trace >= 2) {
                    for (int &v : tangle) {
                        logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                        if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                    }
                }
#endif
                logger << std::endl;
            }
            tangle.clear();
            tangleto.clear();
            continue;
        }
#endif

        if (trace >= 1) {
            logger << "\033[1;38;5;198mnew tangle " << pr << "\033[m (" << tpr.size() << ")";
            logger << " (depth " << cur_depth <<")";
            if (trace >= 2) {
                for (const int v : tangle) {
                    logger << " \033[1;36m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
            }
            logger << " with " << tangleto.size() << " escape vertices.";
            logger << std::endl;
        }

        // new tangle idx
        const int tidx = tpr.size();

        // add back links to all normal vertices in our [out]
        for (unsigned int x = 0; x < tangleto.size(); x++) tin[tangleto[x]].push_back(tidx);

        // move tangleto into vout
        int* _tout = new int[tangleto.size()+1];
        std::copy(&tangleto[0], &tangleto[tangleto.size()], _tout);
        _tout[tangleto.size()] = -1;
        tout.push_back(_tout);

        // move tangle into vv
        int* _vv = new int[tangle.size()*2+1], c=0;
        for (const int v : tangle) {
            _vv[c++] = v;
            _vv[c++] = str[v];
        }
        _vv[c] = -1;
        tv.push_back(_vv);

        // and set p to pr
        tpr.push_back(pr);

        tangles++;
        new_tangles = true;
        tangle.clear();
        tangleto.clear();
    }

    pea_S.clear();
    return new_tangles;
}